

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_utilities.c
# Opt level: O0

size_t check_file(FILE *fh,size_t buffer_size,char delim,size_t fields,int *widths)

{
  char *__s;
  char *pcVar1;
  size_t sVar2;
  char *local_58;
  char *p;
  size_t i;
  size_t lines;
  char *buffer;
  int *widths_local;
  size_t fields_local;
  char delim_local;
  size_t buffer_size_local;
  FILE *fh_local;
  
  __s = (char *)malloc(buffer_size);
  i = 0;
  rewind((FILE *)fh);
  do {
    do {
      pcVar1 = fgets(__s,(int)buffer_size,(FILE *)fh);
      if (pcVar1 == (char *)0x0) {
        rewind((FILE *)fh);
        free(__s);
        return i;
      }
      i = i + 1;
      sVar2 = strlen(__s);
      if (__s[sVar2 - 1] != '\n') {
        fprintf(_stderr,"Line %zu will not fit into a %zu-character buffer.\n",i,buffer_size);
        rewind((FILE *)fh);
        free(__s);
        return 0xffffffffffffffff;
      }
      pcVar1 = strchr(__s,0x23);
      if (pcVar1 != (char *)0x0) {
        *pcVar1 = '\0';
      }
      sVar2 = strlen(__s);
    } while (sVar2 < 2);
    local_58 = next_token(__s,delim);
    for (p = (char *)0x0; p < fields; p = p + 1) {
      if (local_58 == (char *)0x0) {
        fprintf(_stderr,"Line %zu contains less than %zu fields.\n",i,fields);
        rewind((FILE *)fh);
        free(__s);
        return 0xffffffffffffffff;
      }
      if ((-1 < widths[(long)p]) && (sVar2 = strlen(local_58), (uint)widths[(long)p] <= sVar2)) {
        fprintf(_stderr,"Line %zu: Field %zu \'%s\' will not fit in a %d character string.\n",i,
                p + 1,local_58,(ulong)(uint)widths[(long)p]);
        rewind((FILE *)fh);
        free(__s);
        return 0xffffffffffffffff;
      }
      local_58 = next_token((char *)0x0,delim);
    }
    if (local_58 != (char *)0x0) {
      fprintf(_stderr,"Line %zu contains more than %zu fields.\n",i,fields);
      rewind((FILE *)fh);
      free(__s);
      return 0xffffffffffffffff;
    }
  } while( true );
}

Assistant:

size_t check_file( FILE * fh, size_t buffer_size, char delim, size_t fields, int const * widths )
{
    /* Dynamically allocated buffer */
    char * buffer = malloc( buffer_size );
    size_t lines = 0;

    rewind( fh );

    while ( fgets( buffer, buffer_size, fh ) )
    {
        size_t i;
        char * p;

        ++lines;

        /* Check line for complete read */
        if ( buffer[ strlen( buffer ) - 1 ] != '\n' )
        {
            fprintf( stderr, "Line %zu will not fit into a %zu-character buffer.\n", lines, buffer_size );
            rewind( fh );
            free( buffer );
            return -1;
        }

        /* Remove comments */
        if ( ( p = strchr( buffer, '#' ) ) != NULL )
        {
            *p = '\0';
        }

        /* > 1 because of newline */
        if ( strlen( buffer ) > 1 )
        {
            /* Check field count and field widths */
            p = next_token( buffer, delim );

            for ( i = 0; i < fields; ++i )
            {
                if ( ! p )
                {
                    fprintf( stderr, "Line %zu contains less than %zu fields.\n", lines, fields );
                    rewind( fh );
                    free( buffer );
                    return -1;
                }

                if ( widths[ i ] >= 0 && strlen( p ) >= ( unsigned )widths[ i ] )
                {
                    fprintf( stderr, "Line %zu: Field %zu '%s' will not fit in a %d character string.\n", lines, i + 1, p, widths[ i ] );
                    rewind( fh );
                    free( buffer );
                    return -1;
                }

                p = next_token( NULL, delim );
            }

            if ( p )
            {
                fprintf( stderr, "Line %zu contains more than %zu fields.\n", lines, fields );
                rewind( fh );
                free( buffer );
                return -1;
            }
        }
    }

    /* Rewind, free the buffer, and report the number of lines */
    rewind( fh );
    free( buffer );
    return lines;
}